

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

int cimg_library::cimg::dialog<unsigned_char>
              (char *title,char *msg,char *button1_label,char *button2_label,char *button3_label,
              char *button4_label,char *button5_label,char *button6_label,CImg<unsigned_char> *logo,
              bool is_centered)

{
  uint uVar1;
  uint uVar2;
  CImg<unsigned_char> *pCVar3;
  CImgList<unsigned_char> *pCVar4;
  ulong uVar5;
  CImgArgumentException *this;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  char *title_00;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  int y1;
  uint size_x;
  uint uVar20;
  int y0;
  long lVar21;
  int y0_00;
  long lVar22;
  bool bVar23;
  bool bVar24;
  CImgList<unsigned_char> buttons;
  CImg<unsigned_char> canvas;
  CImg<unsigned_char> sbutton;
  CImgList<unsigned_char> sbuttons;
  CImgList<unsigned_char> cbuttons;
  CImg<unsigned_char> local_1c8;
  CImg<unsigned_char> button;
  CImgDisplay disp;
  CImg<unsigned_char> cbutton;
  uint xbuttons [6];
  
  buttons._width = 0;
  buttons._allocated_width = 0;
  buttons._data = (CImg<unsigned_char> *)0x0;
  cbuttons._width = 0;
  cbuttons._allocated_width = 0;
  cbuttons._data = (CImg<unsigned_char> *)0x0;
  sbuttons._width = 0;
  sbuttons._allocated_width = 0;
  sbuttons._data = (CImg<unsigned_char> *)0x0;
  if (button1_label != (char *)0x0) {
    disp._width = 0;
    disp._height = 0;
    disp._timer = 0;
    disp._fps_frames = 0;
    disp._fps_timer._0_1_ = '\0';
    pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,button1_label,"",
                        dialog<unsigned_char>::gray,1.0,0xd);
    uVar17 = buttons._0_8_ & 0xffffffff;
    pCVar4 = CImgList<unsigned_char>::insert(&buttons,1,buttons._width);
    CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
    if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
      operator_delete__((void *)disp._24_8_);
    }
    if (button2_label != (char *)0x0) {
      disp._width = 0;
      disp._height = 0;
      disp._timer = 0;
      disp._fps_frames = 0;
      disp._fps_timer._0_1_ = '\0';
      pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                         ((CImg<unsigned_char> *)&disp,0,0,button2_label,"",
                          dialog<unsigned_char>::gray,1.0,0xd);
      uVar17 = buttons._0_8_ & 0xffffffff;
      pCVar4 = CImgList<unsigned_char>::insert(&buttons,1,buttons._width);
      CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
      if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
        operator_delete__((void *)disp._24_8_);
      }
      if (button3_label != (char *)0x0) {
        disp._width = 0;
        disp._height = 0;
        disp._timer = 0;
        disp._fps_frames = 0;
        disp._fps_timer._0_1_ = '\0';
        pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                           ((CImg<unsigned_char> *)&disp,0,0,button3_label,"",
                            dialog<unsigned_char>::gray,1.0,0xd);
        uVar17 = buttons._0_8_ & 0xffffffff;
        pCVar4 = CImgList<unsigned_char>::insert(&buttons,1,buttons._width);
        CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
        if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
          operator_delete__((void *)disp._24_8_);
        }
        if (button4_label != (char *)0x0) {
          disp._width = 0;
          disp._height = 0;
          disp._timer = 0;
          disp._fps_frames = 0;
          disp._fps_timer._0_1_ = '\0';
          pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                             ((CImg<unsigned_char> *)&disp,0,0,button4_label,"",
                              dialog<unsigned_char>::gray,1.0,0xd);
          uVar17 = buttons._0_8_ & 0xffffffff;
          pCVar4 = CImgList<unsigned_char>::insert(&buttons,1,buttons._width);
          CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
          if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
            operator_delete__((void *)disp._24_8_);
          }
          if (button5_label != (char *)0x0) {
            disp._width = 0;
            disp._height = 0;
            disp._timer = 0;
            disp._fps_frames = 0;
            disp._fps_timer._0_1_ = '\0';
            pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                               ((CImg<unsigned_char> *)&disp,0,0,button5_label,"",
                                dialog<unsigned_char>::gray,1.0,0xd);
            uVar17 = buttons._0_8_ & 0xffffffff;
            pCVar4 = CImgList<unsigned_char>::insert(&buttons,1,buttons._width);
            CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
            if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
              operator_delete__((void *)disp._24_8_);
            }
            if (button6_label != (char *)0x0) {
              disp._width = 0;
              disp._height = 0;
              disp._timer = 0;
              disp._fps_frames = 0;
              disp._fps_timer._0_1_ = '\0';
              pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                                 ((CImg<unsigned_char> *)&disp,0,0,button6_label,"",
                                  dialog<unsigned_char>::gray,1.0,0xd);
              uVar17 = buttons._0_8_ & 0xffffffff;
              pCVar4 = CImgList<unsigned_char>::insert(&buttons,1,buttons._width);
              CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
              if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
                operator_delete__((void *)disp._24_8_);
              }
            }
          }
        }
      }
    }
  }
  if (buttons._width == 0) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::dialog(): No buttons have been defined.");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  uVar13 = 8;
  if ((int)buttons._width < 1) {
    uVar6 = 8;
  }
  else {
    lVar21 = 0;
    lVar22 = 0;
    do {
      CImg<unsigned_char>::resize
                ((CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21),-100,-100,1,3,1,0,
                 0.0,0.0,0.0,0.0);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x20;
    } while (lVar22 < (int)buttons._width);
    uVar6 = 8;
    if (0 < (int)buttons._width) {
      lVar21 = 0;
      uVar6 = 0;
      uVar13 = 0;
      do {
        uVar2 = *(uint *)((long)&(buttons._data)->_width + lVar21);
        uVar20 = *(uint *)((long)&(buttons._data)->_height + lVar21);
        if (uVar2 < uVar6) {
          uVar2 = uVar6;
        }
        uVar6 = uVar2;
        if (uVar20 < uVar13) {
          uVar20 = uVar13;
        }
        uVar13 = uVar20;
        lVar21 = lVar21 + 0x20;
      } while ((long)(int)buttons._width * 0x20 != lVar21);
      uVar6 = uVar6 + 8;
      uVar13 = uVar13 + 8;
    }
  }
  uVar2 = 0x80;
  if (uVar6 < 0x80) {
    uVar2 = uVar6;
  }
  uVar6 = 0x40;
  if (0x40 < uVar2) {
    uVar6 = uVar2;
  }
  uVar2 = 0x30;
  if (uVar13 < 0x30) {
    uVar2 = uVar13;
  }
  uVar13 = 0x18;
  if (0x18 < uVar2) {
    uVar13 = uVar2;
  }
  CImg<unsigned_char>::CImg(&button,uVar6,uVar13,1,3);
  iVar16 = uVar6 - 1;
  y1 = uVar13 - 1;
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            (&button,0,0,0,iVar16,y1,button._depth - 1,dialog<unsigned_char>::gray,1.0);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&button,0,0,iVar16,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,0,y1,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&button,iVar16,0,iVar16,y1,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,iVar16,y1,0,y1,"",1.0,0xffffffff,true);
  y0 = uVar13 - 2;
  iVar14 = uVar6 - 2;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&button,1,y0,iVar14,y0,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,iVar14,y0,iVar14,1,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  CImg<unsigned_char>::CImg(&sbutton,uVar6,uVar13,1,3);
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            (&sbutton,0,0,0,iVar16,y1,sbutton._depth - 1,dialog<unsigned_char>::gray,1.0);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,0,0,iVar16,0,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,iVar16,0,iVar16,y1,"",1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,iVar16,y1,0,y1,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,0,y1,0,0,"",1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,1,1,iVar14,1,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,1,y0,1,1,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,iVar14,1,iVar14,y0,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,iVar14,y0,1,y0,"",1.0,0xffffffff,true);
  iVar10 = uVar13 - 3;
  iVar7 = uVar6 - 3;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,2,iVar10,iVar7,iVar10,dialog<unsigned_char>::gray2,1.0,0xffffffff,
                      true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,iVar7,iVar10,iVar7,2,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  iVar15 = uVar6 - 5;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,4,4,iVar15,4,"",1.0,0xaaaaaaaa,true);
  y0_00 = uVar13 - 5;
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,iVar15,4,iVar15,y0_00,"",1.0,0xaaaaaaaa,false);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,iVar15,y0_00,4,y0_00,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,4,y0_00,4,4,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::CImg(&cbutton,uVar6,uVar13,1,3);
  pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                     (&cbutton,0,0,0,iVar16,y1,cbutton._depth - 1,"",1.0);
  pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                     (pCVar3,1,1,0,iVar14,y0,pCVar3->_depth - 1,dialog<unsigned_char>::gray2,1.0);
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            (pCVar3,2,2,0,iVar7,iVar10,pCVar3->_depth - 1,dialog<unsigned_char>::gray,1.0);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&cbutton,4,4,iVar15,4,"",1.0,0xaaaaaaaa,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,iVar15,4,iVar15,y0_00,"",1.0,0xaaaaaaaa,false);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&cbutton,iVar15,y0_00,4,y0_00,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,4,y0_00,4,4,"",1.0,0xaaaaaaaa,false);
  uVar2 = buttons._width;
  if (0 < (int)buttons._width) {
    lVar21 = 0;
    lVar22 = 0;
    do {
      CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,&cbutton);
      pCVar3 = CImg<unsigned_char>::draw_image
                         ((CImg<unsigned_char> *)&disp,
                          (uVar6 - *(int *)((long)&(buttons._data)->_width + lVar21) >> 1) + 1,
                          (uVar13 - *(int *)((long)&(buttons._data)->_height + lVar21) >> 1) + 1,0,0
                          ,(CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21),1.0);
      uVar17 = cbuttons._0_8_ & 0xffffffff;
      pCVar4 = CImgList<unsigned_char>::insert(&cbuttons,1,cbuttons._width);
      CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
      if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
        operator_delete__((void *)disp._24_8_);
      }
      CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,&sbutton);
      pCVar3 = CImg<unsigned_char>::draw_image
                         ((CImg<unsigned_char> *)&disp,
                          uVar6 - *(int *)((long)&(buttons._data)->_width + lVar21) >> 1,
                          uVar13 - *(int *)((long)&(buttons._data)->_height + lVar21) >> 1,0,0,
                          (CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21),1.0);
      uVar17 = sbuttons._0_8_ & 0xffffffff;
      pCVar4 = CImgList<unsigned_char>::insert(&sbuttons,1,sbuttons._width);
      CImg<unsigned_char>::move_to(pCVar3,pCVar4->_data + uVar17);
      if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
        operator_delete__((void *)disp._24_8_);
      }
      CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,&button);
      pCVar3 = CImg<unsigned_char>::draw_image
                         ((CImg<unsigned_char> *)&disp,
                          uVar6 - *(int *)((long)&(buttons._data)->_width + lVar21) >> 1,
                          uVar13 - *(int *)((long)&(buttons._data)->_height + lVar21) >> 1,0,0,
                          (CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21),1.0);
      CImg<unsigned_char>::move_to
                (pCVar3,(CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21));
      if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
        operator_delete__((void *)disp._24_8_);
      }
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x20;
      uVar2 = buttons._width;
    } while (lVar22 < (int)buttons._width);
  }
  canvas._data = (uchar *)0x0;
  canvas._width = 0;
  canvas._height = 0;
  canvas._depth = 0;
  canvas._spectrum = 0;
  canvas._is_shared = false;
  if (msg == (char *)0x0) {
    iVar7 = 0x24;
    uVar20 = 0;
    bVar23 = true;
  }
  else {
    disp._width = 0;
    disp._height = 0;
    disp._timer = 0;
    disp._fps_frames = 0;
    disp._fps_timer._0_1_ = '\0';
    pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,"%s",dialog<unsigned_char>::gray,0,1.0,0xd,
                        msg);
    pCVar3 = CImg<unsigned_char>::operator*=(pCVar3,-1);
    pCVar3 = CImg<unsigned_char>::operator+=(pCVar3,200);
    pCVar3 = CImg<unsigned_char>::resize(pCVar3,-100,-100,1,3,1,0,0.0,0.0,0.0,0.0);
    CImg<unsigned_char>::move_to(pCVar3,&canvas);
    if (((char)disp._fps_timer == '\0') && (disp._24_8_ != 0)) {
      operator_delete__((void *)disp._24_8_);
    }
    uVar20 = canvas._height;
    bVar23 = canvas._data == (uchar *)0x0;
    iVar7 = canvas._width + 0x24;
    uVar2 = buttons._width;
  }
  iVar10 = (uVar2 - 1) * (uVar6 + 0xc);
  uVar2 = logo->_width;
  uVar11 = iVar7 + uVar2;
  uVar8 = uVar6 + iVar10 + 0x18;
  uVar12 = uVar8;
  if (uVar8 < uVar11) {
    uVar12 = uVar11;
  }
  uVar1 = logo->_height;
  size_x = 0xc4;
  if (0xc4 < uVar12) {
    size_x = uVar12;
  }
  uVar9 = uVar20 + uVar13 + 0x24;
  uVar12 = uVar1 + uVar13 + 0x24;
  if (uVar12 < uVar9) {
    uVar12 = uVar9;
  }
  uVar9 = 0x60;
  if (0x60 < uVar12) {
    uVar9 = uVar12;
  }
  iVar14 = (uVar9 - 0xc) - uVar13;
  iVar7 = 0xc;
  if (bVar23) {
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,size_x,uVar9,1,3);
    iVar15 = size_x - 1;
    iVar7 = uVar9 - 1;
    pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,0,iVar15,iVar7,(int)disp._fps_frames + -1,
                        dialog<unsigned_char>::gray,1.0);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,0,iVar15,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,iVar7,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar15,0,iVar15,iVar7,"",1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar15,iVar7,0,iVar7,"",1.0,0xffffffff,true);
    CImg<unsigned_char>::assign
              (&canvas,pCVar3->_data,pCVar3->_width,pCVar3->_height,pCVar3->_depth,pCVar3->_spectrum
              );
    iVar7 = ((size_x - uVar2) - 0x18 >> 1) + 0xc;
  }
  else {
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,size_x,uVar9,1,3);
    iVar16 = size_x - 1;
    iVar15 = uVar9 - 1;
    pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,0,iVar16,iVar15,(int)disp._fps_frames + -1,
                        dialog<unsigned_char>::gray,1.0);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,0,iVar16,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,iVar15,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar16,0,iVar16,iVar15,"",1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar16,iVar15,0,iVar15,"",1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_image
                       (pCVar3,uVar2 + 0x18,iVar14 - uVar20 >> 1,0,0,&canvas,1.0);
    CImg<unsigned_char>::assign
              (&canvas,pCVar3->_data,pCVar3->_width,pCVar3->_height,pCVar3->_depth,pCVar3->_spectrum
              );
  }
  if (((char)disp._fps_timer == '\0') && ((void *)disp._24_8_ != (void *)0x0)) {
    operator_delete__((void *)disp._24_8_);
  }
  if (logo->_data != (uchar *)0x0) {
    CImg<unsigned_char>::draw_image(&canvas,iVar7,iVar14 - uVar1 >> 1,0,0,logo,1.0);
  }
  xbuttons[0] = 0;
  xbuttons[1] = 0;
  xbuttons[2] = 0;
  xbuttons[3] = 0;
  xbuttons[4] = 0;
  xbuttons[5] = 0;
  if (0 < (int)buttons._width) {
    if (uVar11 < uVar8) {
      uVar11 = uVar8;
    }
    uVar13 = 0xc4;
    if (0xc4 < uVar11) {
      uVar13 = uVar11;
    }
    uVar13 = (uVar13 - iVar10) - uVar6 >> 1;
    lVar22 = 0;
    lVar21 = 0;
    do {
      xbuttons[lVar21] = uVar13;
      CImg<unsigned_char>::draw_image
                (&canvas,uVar13,iVar14,0,0,
                 (CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar22),1.0);
      lVar21 = lVar21 + 1;
      uVar13 = uVar13 + uVar6 + 0xc;
      lVar22 = lVar22 + 0x20;
    } while (lVar21 < (int)buttons._width);
  }
  title_00 = " ";
  if (title != (char *)0x0) {
    title_00 = title;
  }
  CImgDisplay::CImgDisplay<unsigned_char>(&disp,&canvas,title_00,0,false,is_centered);
  if (is_centered) {
    iVar7 = CImgDisplay::screen_width();
    uVar13 = disp._width;
    iVar10 = CImgDisplay::screen_height();
    CImgDisplay::move(&disp,(int)(iVar7 - uVar13) / 2,(int)(iVar10 - disp._height) / 2);
  }
  uVar13 = 0xffffffff;
  if (disp._is_closed == false) {
    uVar2 = 0xffffffff;
    bVar23 = false;
    uVar17 = 0xffffffff;
    do {
      if (bVar23) {
        if ((int)uVar2 < 0) {
          if ((int)uVar17 < 0) {
            CImgDisplay::display<unsigned_char>(&disp,&canvas);
            goto LAB_00177bf0;
          }
          CImg<unsigned_char>::CImg(&local_1c8,&canvas);
          pCVar3 = CImg<unsigned_char>::draw_image
                             (&local_1c8,xbuttons[uVar17],iVar14,0,0,sbuttons._data + uVar17,1.0);
          CImgDisplay::display<unsigned_char>(&disp,pCVar3);
        }
        else {
          CImg<unsigned_char>::CImg(&local_1c8,&canvas);
          pCVar3 = CImg<unsigned_char>::draw_image
                             (&local_1c8,xbuttons[uVar2],iVar14,0,0,cbuttons._data + uVar2,1.0);
          CImgDisplay::display<unsigned_char>(&disp,pCVar3);
        }
        if ((local_1c8._is_shared == false) && (local_1c8._data != (uchar *)0x0)) {
          operator_delete__(local_1c8._data);
        }
      }
LAB_00177bf0:
      CImgDisplay::wait(&disp,(void *)0xf);
      if (disp._is_resized == true) {
        CImgDisplay::resize(&disp,disp._width,disp._height,false);
      }
      if (((byte)disp._button & 1) == 0) {
        bVar24 = -1 < (int)uVar2;
        bVar23 = false;
      }
      else {
        if ((long)(int)buttons._width < 1) {
          bVar18 = 0;
          uVar13 = 0xffffffff;
        }
        else {
          uVar5 = 0xffffffff;
          uVar19 = 0;
          bVar18 = 0;
          do {
            if (((disp._mouse_y < (int)(uVar9 - 0xc) && iVar14 <= disp._mouse_y) &&
                ((int)xbuttons[uVar19] <= disp._mouse_x)) &&
               (disp._mouse_x < (int)(xbuttons[uVar19] + uVar6))) {
              bVar18 = 1;
              uVar17 = uVar19 & 0xffffffff;
              uVar5 = uVar19 & 0xffffffff;
            }
            uVar13 = (uint)uVar5;
            uVar19 = uVar19 + 1;
          } while ((long)(int)buttons._width != uVar19);
        }
        bVar23 = (bool)(uVar13 != uVar2 | bVar18);
        bVar24 = false;
        uVar2 = uVar13;
      }
      uVar13 = *disp._keys;
      uVar12 = (uint)uVar17;
      uVar20 = uVar12;
      if ((int)uVar13 < 0xff1b) {
        if (uVar13 != 0) {
          if (uVar13 == 0xff09) {
LAB_00177cf8:
            iVar7 = uVar12 + 1;
            goto LAB_00177d0e;
          }
          if (uVar13 == 0xff0d) {
            uVar20 = 0;
            if (0 < (int)uVar12) {
              uVar20 = uVar12;
            }
LAB_00177d23:
            bVar24 = true;
          }
          goto LAB_00177d25;
        }
      }
      else {
        if (uVar13 - 0xff51 < 2) {
          iVar7 = buttons._width + uVar12 + -1;
LAB_00177d0e:
          uVar20 = iVar7 % (int)buttons._width;
        }
        else {
          if (uVar13 - 0xff53 < 2) goto LAB_00177cf8;
          if (uVar13 == 0xff1b) {
            uVar20 = 0xffffffff;
            goto LAB_00177d23;
          }
        }
LAB_00177d25:
        CImgDisplay::set_key(&disp);
        bVar23 = (bool)(uVar20 != uVar12 | bVar23);
        uVar17 = (ulong)uVar20;
      }
      uVar13 = (uint)uVar17;
    } while ((disp._is_closed == false) && (!bVar24));
  }
  uVar6 = disp._width;
  uVar2 = disp._height;
  CImgDisplay::~CImgDisplay(&disp);
  if ((canvas._is_shared == false) && (canvas._data != (uchar *)0x0)) {
    operator_delete__(canvas._data);
  }
  if ((cbutton._is_shared == false) && (cbutton._data != (uchar *)0x0)) {
    operator_delete__(cbutton._data);
  }
  if ((sbutton._is_shared == false) && (sbutton._data != (uchar *)0x0)) {
    operator_delete__(sbutton._data);
  }
  if ((button._is_shared == false) && (button._data != (uchar *)0x0)) {
    operator_delete__(button._data);
  }
  CImgList<unsigned_char>::~CImgList(&sbuttons);
  CImgList<unsigned_char>::~CImgList(&cbuttons);
  CImgList<unsigned_char>::~CImgList(&buttons);
  return -(uint)(uVar2 == 0) | uVar13 | -(uint)(uVar6 == 0);
}

Assistant:

inline int dialog(const char *const title, const char *const msg,
                      const char *const button1_label, const char *const button2_label,
                      const char *const button3_label, const char *const button4_label,
                      const char *const button5_label, const char *const button6_label,
                      const CImg<t>& logo, const bool is_centered=false) {
#if cimg_display==0
      cimg::unused(title,msg,button1_label,button2_label,button3_label,button4_label,button5_label,button6_label,
                   logo._data,is_centered);
      throw CImgIOException("cimg::dialog(): No display available.");
#else
      static const unsigned char
        black[] = { 0,0,0 }, white[] = { 255,255,255 }, gray[] = { 200,200,200 }, gray2[] = { 150,150,150 };

      // Create buttons and canvas graphics
      CImgList<unsigned char> buttons, cbuttons, sbuttons;
      if (button1_label) {
        CImg<unsigned char>().draw_text(0,0,button1_label,black,gray,1,13).move_to(buttons);
        if (button2_label) {
          CImg<unsigned char>().draw_text(0,0,button2_label,black,gray,1,13).move_to(buttons);
          if (button3_label) {
            CImg<unsigned char>().draw_text(0,0,button3_label,black,gray,1,13).move_to(buttons);
            if (button4_label) {
              CImg<unsigned char>().draw_text(0,0,button4_label,black,gray,1,13).move_to(buttons);
              if (button5_label) {
                CImg<unsigned char>().draw_text(0,0,button5_label,black,gray,1,13).move_to(buttons);
                if (button6_label) {
                  CImg<unsigned char>().draw_text(0,0,button6_label,black,gray,1,13).move_to(buttons);
                }}}}}}
      if (!buttons._width)
        throw CImgArgumentException("cimg::dialog(): No buttons have been defined.");
      cimglist_for(buttons,l) buttons[l].resize(-100,-100,1,3);

      unsigned int bw = 0, bh = 0;
      cimglist_for(buttons,l) { bw = std::max(bw,buttons[l]._width); bh = std::max(bh,buttons[l]._height); }
      bw+=8; bh+=8;
      if (bw<64) bw = 64;
      if (bw>128) bw = 128;
      if (bh<24) bh = 24;
      if (bh>48) bh = 48;

      CImg<unsigned char> button(bw,bh,1,3);
      button.draw_rectangle(0,0,bw - 1,bh - 1,gray);
      button.draw_line(0,0,bw - 1,0,white).draw_line(0,bh - 1,0,0,white);
      button.draw_line(bw - 1,0,bw - 1,bh - 1,black).draw_line(bw - 1,bh - 1,0,bh - 1,black);
      button.draw_line(1,bh - 2,bw - 2,bh - 2,gray2).draw_line(bw - 2,bh - 2,bw - 2,1,gray2);
      CImg<unsigned char> sbutton(bw,bh,1,3);
      sbutton.draw_rectangle(0,0,bw - 1,bh - 1,gray);
      sbutton.draw_line(0,0,bw - 1,0,black).draw_line(bw - 1,0,bw - 1,bh - 1,black);
      sbutton.draw_line(bw - 1,bh - 1,0,bh - 1,black).draw_line(0,bh - 1,0,0,black);
      sbutton.draw_line(1,1,bw - 2,1,white).draw_line(1,bh - 2,1,1,white);
      sbutton.draw_line(bw - 2,1,bw - 2,bh - 2,black).draw_line(bw - 2,bh - 2,1,bh - 2,black);
      sbutton.draw_line(2,bh - 3,bw - 3,bh - 3,gray2).draw_line(bw - 3,bh - 3,bw - 3,2,gray2);
      sbutton.draw_line(4,4,bw - 5,4,black,1,0xAAAAAAAA,true).
        draw_line(bw - 5,4,bw - 5,bh - 5,black,1,0xAAAAAAAA,false);
      sbutton.draw_line(bw - 5,bh - 5,4,bh - 5,black,1,0xAAAAAAAA,false).
        draw_line(4,bh - 5,4,4,black,1,0xAAAAAAAA,false);
      CImg<unsigned char> cbutton(bw,bh,1,3);
      cbutton.draw_rectangle(0,0,bw - 1,bh - 1,black).draw_rectangle(1,1,bw - 2,bh - 2,gray2).
        draw_rectangle(2,2,bw - 3,bh - 3,gray);
      cbutton.draw_line(4,4,bw - 5,4,black,1,0xAAAAAAAA,true).
        draw_line(bw - 5,4,bw - 5,bh - 5,black,1,0xAAAAAAAA,false);
      cbutton.draw_line(bw - 5,bh - 5,4,bh - 5,black,1,0xAAAAAAAA,false).
        draw_line(4,bh - 5,4,4,black,1,0xAAAAAAAA,false);

      cimglist_for(buttons,ll) {
        CImg<unsigned char>(cbutton).
          draw_image(1 + (bw  -buttons[ll].width())/2,1 + (bh - buttons[ll].height())/2,buttons[ll]).
          move_to(cbuttons);
        CImg<unsigned char>(sbutton).
          draw_image((bw - buttons[ll].width())/2,(bh - buttons[ll].height())/2,buttons[ll]).
          move_to(sbuttons);
        CImg<unsigned char>(button).
          draw_image((bw - buttons[ll].width())/2,(bh - buttons[ll].height())/2,buttons[ll]).
          move_to(buttons[ll]);
      }

      CImg<unsigned char> canvas;
      if (msg)
        ((CImg<unsigned char>().draw_text(0,0,"%s",gray,0,1,13,msg)*=-1)+=200).resize(-100,-100,1,3).move_to(canvas);

      const unsigned int
        bwall = (buttons._width - 1)*(12 + bw) + bw,
        w = cimg::max(196U,36 + logo._width + canvas._width,24 + bwall),
        h = cimg::max(96U,36 + canvas._height + bh,36 + logo._height + bh),
        lx = 12 + (canvas._data?0:((w - 24 - logo._width)/2)),
        ly = (h - 12 - bh - logo._height)/2,
        tx = lx + logo._width + 12,
        ty = (h - 12 - bh - canvas._height)/2,
        bx = (w - bwall)/2,
        by = h - 12 - bh;

      if (canvas._data)
        canvas = CImg<unsigned char>(w,h,1,3).
          draw_rectangle(0,0,w - 1,h - 1,gray).
          draw_line(0,0,w - 1,0,white).draw_line(0,h - 1,0,0,white).
          draw_line(w - 1,0,w - 1,h - 1,black).draw_line(w - 1,h - 1,0,h - 1,black).
          draw_image(tx,ty,canvas);
      else
        canvas = CImg<unsigned char>(w,h,1,3).
          draw_rectangle(0,0,w - 1,h - 1,gray).
          draw_line(0,0,w - 1,0,white).draw_line(0,h - 1,0,0,white).
          draw_line(w - 1,0,w - 1,h - 1,black).draw_line(w - 1,h - 1,0,h - 1,black);
      if (logo._data) canvas.draw_image(lx,ly,logo);

      unsigned int xbuttons[6] = { 0 };
      cimglist_for(buttons,lll) {
        xbuttons[lll] = bx + (bw + 12)*lll;
        canvas.draw_image(xbuttons[lll],by,buttons[lll]);
      }

      // Open window and enter events loop
      CImgDisplay disp(canvas,title?title:" ",0,false,is_centered?true:false);
      if (is_centered) disp.move((CImgDisplay::screen_width() - disp.width())/2,
                                 (CImgDisplay::screen_height() - disp.height())/2);
      bool stop_flag = false, refresh = false;
      int oselected = -1, oclicked = -1, selected = -1, clicked = -1;
      while (!disp.is_closed() && !stop_flag) {
        if (refresh) {
          if (clicked>=0)
            CImg<unsigned char>(canvas).draw_image(xbuttons[clicked],by,cbuttons[clicked]).display(disp);
          else {
            if (selected>=0)
              CImg<unsigned char>(canvas).draw_image(xbuttons[selected],by,sbuttons[selected]).display(disp);
            else canvas.display(disp);
          }
          refresh = false;
        }
        disp.wait(15);
        if (disp.is_resized()) disp.resize(disp,false);

        if (disp.button()&1)  {
          oclicked = clicked;
          clicked = -1;
          cimglist_for(buttons,l)
            if (disp.mouse_y()>=(int)by && disp.mouse_y()<(int)(by + bh) &&
                disp.mouse_x()>=(int)xbuttons[l] && disp.mouse_x()<(int)(xbuttons[l] + bw)) {
              clicked = selected = l;
              refresh = true;
            }
          if (clicked!=oclicked) refresh = true;
        } else if (clicked>=0) stop_flag = true;

        if (disp.key()) {
          oselected = selected;
          switch (disp.key()) {
          case cimg::keyESC : selected = -1; stop_flag = true; break;
          case cimg::keyENTER : if (selected<0) selected = 0; stop_flag = true; break;
          case cimg::keyTAB :
          case cimg::keyARROWRIGHT :
          case cimg::keyARROWDOWN : selected = (selected + 1)%buttons.width(); break;
          case cimg::keyARROWLEFT :
          case cimg::keyARROWUP : selected = (selected + buttons.width() - 1)%buttons.width(); break;
          }
          disp.set_key();
          if (selected!=oselected) refresh = true;
        }
      }
      if (!disp) selected = -1;
      return selected;
#endif
    }